

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O2

int __thiscall
unodb::detail::
basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::init(basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
       *this,EVP_PKEY_CTX *ctx)

{
  uint child_i;
  int extraout_EAX;
  long lVar1;
  byte bVar2;
  ulong in_RCX;
  long in_RDX;
  undefined1 local_28 [8];
  db_inode_reclaimable_ptr<unodb::detail::olc_inode_256<std::span<const_std::byte>,_std::span<const_std::byte>_>_>
  reclaim_source_node;
  leaf_reclaimable_ptr r;
  
  *(undefined8 *)(in_RDX + 0x28 + (in_RCX & 0xffffffff) * 8) = 0;
  bVar2 = 0;
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
    if (*(long *)(in_RDX + 0x28 + lVar1 * 8) != 0) {
      (this->child_indexes)._M_elems[lVar1].value.super___atomic_base<unsigned_char>._M_i = bVar2;
      *(undefined8 *)((long)&this->children + (ulong)bVar2 * 8) =
           *(undefined8 *)(in_RDX + 0x28 + lVar1 * 8);
      bVar2 = bVar2 + 1;
      if (bVar2 == 0x30) break;
    }
  }
  local_28 = (undefined1  [8])ctx;
  reclaim_source_node._M_t.
  super___uniq_ptr_impl<unodb::detail::olc_inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::olc_inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::db_inode_qsbr_deleter<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Head_base<0UL,_unodb::detail::olc_inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
  ._M_head_impl =
       (olc_inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
        *)ctx;
  std::
  unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 *)&reclaim_source_node._M_t.
                    super___uniq_ptr_impl<unodb::detail::olc_inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_unodb::detail::olc_inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::db_inode_qsbr_deleter<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                    .
                    super__Head_base<0UL,_unodb::detail::olc_inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
               );
  std::
  unique_ptr<unodb::detail::olc_inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 *)local_28);
  return extraout_EAX;
}

Assistant:

constexpr void init(db_type &db_instance,
                      inode256_type &__restrict source_node,
                      std::uint8_t child_to_delete) noexcept {
    const auto reclaim_source_node{
        ArtPolicy::template make_db_inode_reclaimable_ptr<inode256_type>(
            &source_node, db_instance)};
    const auto r{ArtPolicy::reclaim_leaf_on_scope_exit(
        source_node.children[child_to_delete]
            .load()
            .template ptr<leaf_type *>(),
        db_instance)};

    source_node.children[child_to_delete] = node_ptr{nullptr};

    std::uint8_t next_child = 0;
    for (unsigned child_i = 0; child_i < 256; child_i++) {
      const auto child_ptr = source_node.children[child_i].load();
      if (child_ptr == nullptr) continue;

      child_indexes[child_i] = next_child;
      children.pointer_array[next_child] = source_node.children[child_i].load();
      ++next_child;

      if (next_child == basic_inode_48::capacity) return;
    }
  }